

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O0

void __thiscall Conn::del_conn(Conn *this,int fd)

{
  FILE *__stream;
  bool bVar1;
  size_type sVar2;
  _Self local_28;
  _Self local_20;
  iterator it;
  int fd_local;
  Conn *this_local;
  
  __stream = _stderr;
  it._M_node._4_4_ = fd;
  sVar2 = std::map<int,_ConnInfo,_std::less<int>,_std::allocator<std::pair<const_int,_ConnInfo>_>_>
          ::size(&this->_conn_info_map);
  fprintf(__stream,"%s(%d)-<%s>: cur conn fd size %lu\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp",
          0xcf,"del_conn",sVar2);
  fflush(_stderr);
  std::map<int,_ConnInfo,_std::less<int>,_std::allocator<std::pair<const_int,_ConnInfo>_>_>::size
            (&this->_conn_info_map);
  local_20._M_node =
       (_Base_ptr)
       std::map<int,_ConnInfo,_std::less<int>,_std::allocator<std::pair<const_int,_ConnInfo>_>_>::
       find(&this->_conn_info_map,(key_type *)((long)&it._M_node + 4));
  local_28._M_node =
       (_Base_ptr)
       std::map<int,_ConnInfo,_std::less<int>,_std::allocator<std::pair<const_int,_ConnInfo>_>_>::
       end(&this->_conn_info_map);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    std::map<int,ConnInfo,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>::
    erase_abi_cxx11_((map<int,ConnInfo,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>
                      *)&this->_conn_info_map,(iterator)local_20._M_node);
  }
  Epoll::del_event(&this->_epoll,it._M_node._4_4_,5);
  close(it._M_node._4_4_);
  return;
}

Assistant:

void Conn::del_conn(const int fd)
{
    LOG_PRINT("cur conn fd size %lu", _conn_info_map.size());
    if (_conn_info_map.size() < 0)
    {
        LOG_PRINT("have no fds");
        return ;
    }

    std::map<int, ConnInfo>::iterator it = _conn_info_map.find(fd);
    if (it != _conn_info_map.end())
    {
        _conn_info_map.erase(it);
    }

    _epoll.del_event(fd, EPOLLIN|EPOLLOUT);
    close(fd);
}